

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

uint64_t __thiscall rcg::Buffer::getTimestampNS(Buffer *this)

{
  void *pvVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  Device *local_28;
  
  pvVar1 = Stream::getHandle(this->parent);
  uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,pvVar1,this->buffer,0x1c);
  if (uVar2 == 0) {
    Stream::getParent((Stream *)&stack0xffffffffffffffd8);
    uVar3 = Device::getTimestampFrequency(local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    pvVar1 = Stream::getHandle(this->parent);
    uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,pvVar1,this->buffer,3);
    if ((uVar3 != 0) && (uVar3 != 1000000000)) {
      uVar2 = ((uVar2 % uVar3) * 1000000000) / uVar3 + (uVar2 / uVar3) * 1000000000;
    }
  }
  return uVar2;
}

Assistant:

uint64_t Buffer::getTimestampNS() const
{
  uint64_t ret=getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                        GenTL::BUFFER_INFO_TIMESTAMP_NS);

  // if timestamp in nano seconds is not available, then compute it from
  // timestamp and device frequency

  if (ret == 0)
  {
    const uint64_t ns_freq=1000000000ul;
    uint64_t freq=parent->getParent()->getTimestampFrequency();

    if (freq == 0)
    {
      freq=ns_freq;
    }

    ret=getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                 GenTL::BUFFER_INFO_TIMESTAMP);

    if (freq != ns_freq)
    {
      ret=ret/freq*ns_freq+(ns_freq*(ret%freq))/freq;
    }
  }

  return ret;
}